

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_still.cpp
# Opt level: O1

void __thiscall raspicam::RaspiCam_Still::RaspiCam_Still(RaspiCam_Still *this)

{
  Private_Impl_Still *this_00;
  
  this_00 = (Private_Impl_Still *)operator_new(0x80);
  this_00->API_NAME = "Private_Impl_Still";
  _private::Private_Impl_Still::setDefaults(this_00);
  this_00->_isInitialized = false;
  this_00->camera = (MMAL_COMPONENT_T *)0x0;
  this_00->encoder = (MMAL_COMPONENT_T *)0x0;
  this_00->encoder_connection = (MMAL_CONNECTION_T *)0x0;
  this_00->encoder_pool = (MMAL_POOL_T *)0x0;
  this_00->camera_still_port = (MMAL_PORT_T *)0x0;
  this_00->encoder_input_port = (MMAL_PORT_T *)0x0;
  this_00->encoder_output_port = (MMAL_PORT_T *)0x0;
  this->_impl = this_00;
  return;
}

Assistant:

RaspiCam_Still::RaspiCam_Still() {
        _impl= new _private::Private_Impl_Still() ;
    }